

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O2

bool __thiscall
cmOrderDirectoriesConstraintLibrary::FindConflict
          (cmOrderDirectoriesConstraintLibrary *this,string *dir)

{
  string *name;
  bool bVar1;
  cmOrderDirectories *pcVar2;
  bool bVar3;
  pointer __lhs;
  string ext;
  string lib;
  string fname;
  
  name = &(this->super_cmOrderDirectoriesConstraint).FileName;
  bVar1 = cmOrderDirectoriesConstraint::FileMayConflict
                    (&this->super_cmOrderDirectoriesConstraint,dir,name);
  bVar3 = true;
  if (!bVar1) {
    pcVar2 = (this->super_cmOrderDirectoriesConstraint).OD;
    if (((pcVar2->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (pcVar2->LinkExtensions).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (bVar1 = cmsys::RegularExpression::find(&pcVar2->RemoveLibraryExtension,name), bVar1)) {
      cmsys::RegularExpression::match_abi_cxx11_
                (&lib,&((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension,1);
      cmsys::RegularExpression::match_abi_cxx11_
                (&ext,&((this->super_cmOrderDirectoriesConstraint).OD)->RemoveLibraryExtension,2);
      pcVar2 = (this->super_cmOrderDirectoriesConstraint).OD;
      for (__lhs = (pcVar2->LinkExtensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __lhs != (pcVar2->LinkExtensions).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; __lhs = __lhs + 1) {
        bVar1 = std::operator!=(__lhs,&ext);
        if (bVar1) {
          std::__cxx11::string::string((string *)&fname,(string *)&lib);
          std::__cxx11::string::append((string *)&fname);
          bVar1 = cmOrderDirectoriesConstraint::FileMayConflict
                            (&this->super_cmOrderDirectoriesConstraint,dir,&fname);
          std::__cxx11::string::~string((string *)&fname);
          if (bVar1) {
            std::__cxx11::string::~string((string *)&ext);
            std::__cxx11::string::~string((string *)&lib);
            return true;
          }
        }
        pcVar2 = (this->super_cmOrderDirectoriesConstraint).OD;
      }
      std::__cxx11::string::~string((string *)&ext);
      std::__cxx11::string::~string((string *)&lib);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmOrderDirectoriesConstraintLibrary::FindConflict(std::string const& dir)
{
  // We have the library file name.  Check if it will be found.
  if (this->FileMayConflict(dir, this->FileName)) {
    return true;
  }

  // Now check if the file exists with other extensions the linker
  // might consider.
  if (!this->OD->LinkExtensions.empty() &&
      this->OD->RemoveLibraryExtension.find(this->FileName)) {
    std::string lib = this->OD->RemoveLibraryExtension.match(1);
    std::string ext = this->OD->RemoveLibraryExtension.match(2);
    for (std::vector<std::string>::iterator i =
           this->OD->LinkExtensions.begin();
         i != this->OD->LinkExtensions.end(); ++i) {
      if (*i != ext) {
        std::string fname = lib;
        fname += *i;
        if (this->FileMayConflict(dir, fname)) {
          return true;
        }
      }
    }
  }
  return false;
}